

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Client_readArrayDimensionsAttribute
          (UA_Client *client,UA_NodeId nodeId,UA_UInt32 **outArrayDimensions,
          size_t *outArrayDimensionsSize)

{
  size_t sVar1;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 local_118 [24];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined1 local_c8 [8];
  UA_ReadResponse response;
  
  local_120 = local_118;
  uStack_f8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  local_f0 = 0;
  uStack_e8 = 0;
  local_118._0_2_ = nodeId.namespaceIndex;
  local_118._2_2_ = nodeId._2_2_;
  local_118._4_4_ = nodeId.identifierType;
  local_118._8_8_ = nodeId.identifier.string.length;
  local_118._16_8_ = nodeId.identifier.string.data;
  local_100 = 0x10;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_128 = 1;
  __UA_Client_Service(client,&local_1a8,UA_TYPES + 0x87,local_c8,UA_TYPES + 0x85);
  if (response.responseHeader.timestamp._4_4_ != 0) goto LAB_001245c4;
  if (response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1) {
    response.responseHeader.timestamp._4_4_ = *(UA_StatusCode *)(response.resultsSize + 0x38);
    if (response.responseHeader.timestamp._4_4_ != 0) goto LAB_001245c4;
    if ((*(byte *)response.resultsSize & 2) != 0) {
      response.responseHeader.timestamp._4_4_ = 1;
      goto LAB_001245c4;
    }
    if (((*(byte *)response.resultsSize & 1) != 0) &&
       ((sVar1 = *(size_t *)(response.resultsSize + 0x18), sVar1 != 0 ||
        ((*(ulong *)(response.resultsSize + 0x20) < 2 &&
         (*(ulong *)(response.resultsSize + 0x20) < 2)))))) {
      response.responseHeader.timestamp._4_4_ = 0x80010000;
      if (*(long *)(response.resultsSize + 8) == 0x13b4b0) {
        *outArrayDimensions = *(UA_UInt32 **)(response.resultsSize + 0x20);
        *outArrayDimensionsSize = sVar1;
        *(undefined8 *)(response.resultsSize + 0x18) = 0;
        *(undefined8 *)(response.resultsSize + 0x20) = 0;
        response.responseHeader.timestamp._4_4_ = 0;
      }
      goto LAB_001245c4;
    }
  }
  response.responseHeader.timestamp._4_4_ = 0x80010000;
LAB_001245c4:
  UA_ReadResponse_deleteMembers((UA_ReadResponse *)local_c8);
  return response.responseHeader.timestamp._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_readArrayDimensionsAttribute(UA_Client *client, const UA_NodeId nodeId,
                                       UA_UInt32 **outArrayDimensions,
                                       size_t *outArrayDimensionsSize) {
    UA_ReadValueId item;
    UA_ReadValueId_init(&item);
    item.nodeId = nodeId;
    item.attributeId = UA_ATTRIBUTEID_ARRAYDIMENSIONS;
    UA_ReadRequest request;
    UA_ReadRequest_init(&request);
    request.nodesToRead = &item;
    request.nodesToReadSize = 1;
    UA_ReadResponse response = UA_Client_Service_read(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD) {
        if(response.resultsSize == 1)
            retval = response.results[0].status;
        else
            retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    if(retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    UA_DataValue *res = response.results;
    if(res->hasStatus != UA_STATUSCODE_GOOD)
        retval = res->hasStatus;
    else if(!res->hasValue || UA_Variant_isScalar(&res->value))
        retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    if(retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    if(UA_Variant_isScalar(&res->value) ||
       res->value.type != &UA_TYPES[UA_TYPES_UINT32]) {
        retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
        goto cleanup;
    }

    /* Move data out of the results structure instead of copying */
    *outArrayDimensions = res->value.data;
    *outArrayDimensionsSize = res->value.arrayLength;
    res->value.data = NULL;
    res->value.arrayLength = 0;

 cleanup:
    UA_ReadResponse_deleteMembers(&response);
    return retval;

}